

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::NewKey
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  hash_t hVar1;
  char *pcVar2;
  undefined4 uVar3;
  DWORD DVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  FString local_48;
  FString local_40;
  FString local_38;
  
  FString::AttachToOther(&local_38,key);
  pNVar9 = this->Nodes;
  DVar4 = SuperFastHash(local_38.Chars,(ulong)*(uint *)(local_38.Chars + -0xc));
  pNVar9 = pNVar9 + (this->Size - 1 & DVar4);
  FString::~FString(&local_38);
  if (pNVar9->Next == (Node *)0x1) {
    pNVar9->Next = (Node *)0x0;
  }
  else {
    pNVar5 = this->LastFree;
    do {
      pNVar6 = pNVar5 + -1;
      pNVar8 = (Node *)0x0;
      if (pNVar5 <= this->Nodes) break;
      pNVar8 = pNVar6;
      pNVar5 = pNVar6;
    } while (pNVar6->Next != (Node *)0x1);
    this->LastFree = pNVar6;
    if (pNVar8 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      FString::AttachToOther(&local_40,key);
      pNVar5 = NewKey(this,&local_40);
      FString::~FString(&local_40);
    }
    else {
      FString::AttachToOther(&local_48,&(pNVar9->Pair).Key);
      pNVar5 = this->Nodes;
      DVar4 = SuperFastHash(local_48.Chars,(ulong)*(uint *)(local_48.Chars + -0xc));
      hVar1 = this->Size;
      FString::~FString(&local_48);
      pNVar6 = pNVar5 + (hVar1 - 1 & DVar4);
      if (pNVar5 + (hVar1 - 1 & DVar4) == pNVar9) {
        pNVar8->Next = pNVar9->Next;
        pNVar6 = pNVar8;
        pNVar7 = pNVar8;
      }
      else {
        do {
          pNVar7 = pNVar6;
          pNVar6 = pNVar7->Next;
        } while (pNVar6 != pNVar9);
        pNVar7->Next = pNVar8;
        uVar3 = *(undefined4 *)&(pNVar9->Pair).field_0xc;
        (pNVar8->Pair).Value = (FMissingCount)(pNVar9->Pair).Value.Count;
        *(undefined4 *)&(pNVar8->Pair).field_0xc = uVar3;
        pcVar2 = (pNVar9->Pair).Key.Chars;
        pNVar8->Next = pNVar9->Next;
        (pNVar8->Pair).Key.Chars = pcVar2;
        pNVar6 = (Node *)0x0;
        pNVar7 = pNVar9;
      }
      pNVar9->Next = pNVar6;
      pNVar9 = pNVar7;
    }
    if (pNVar8 == (Node *)0x0) {
      return pNVar5;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  FString::AttachToOther(&(pNVar9->Pair).Key,key);
  return pNVar9;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}